

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O0

void pnga_step_bound_info
               (Integer g_xx,Integer g_vv,Integer g_xxll,Integer g_xxuu,void *boundmin,
               void *wolfemin,void *boundmax)

{
  Integer xxuuhi [7];
  Integer xxuulo [7];
  Integer xxllhi [7];
  Integer xxlllo [7];
  Integer vvhi [7];
  Integer vvlo [7];
  Integer xxhi [7];
  Integer xxlo [7];
  Integer xxuundim;
  Integer xxuutype;
  Integer xxllndim;
  Integer xxlltype;
  Integer vvndim;
  Integer vvtype;
  Integer xxndim;
  Integer xxtype;
  undefined8 local_258 [16];
  undefined8 local_1d8 [16];
  undefined8 local_158 [16];
  Integer *in_stack_ffffffffffffff28;
  Integer *in_stack_ffffffffffffff30;
  Integer *in_stack_ffffffffffffff38;
  Integer in_stack_ffffffffffffff40;
  long local_a0;
  long local_90;
  long local_80;
  long local_70;
  
  pnga_inquire(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
  pnga_inquire(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
  pnga_inquire(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
  pnga_inquire(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff28);
  while (local_70 != 0) {
    *(undefined8 *)(&stack0xffffffffffffff28 + (local_70 + -1) * 8) = 1;
    local_70 = local_70 + -1;
    local_158[local_80 + -1] = 1;
    local_80 = local_80 + -1;
    local_1d8[local_90 + -1] = 1;
    local_90 = local_90 + -1;
    local_258[local_a0 + -1] = 1;
    local_a0 = local_a0 + -1;
  }
  pnga_step_bound_info_patch
            (xxuutype,(Integer *)xxuundim,(Integer *)xxlo[6],xxlo[5],(Integer *)xxlo[4],
             (Integer *)xxlo[3],vvtype,(Integer *)xxndim,(Integer *)xxtype,(Integer)wolfemin,
             (Integer *)boundmin,(Integer *)g_xxuu,(void *)g_xxll,(void *)g_vv,(void *)g_xx);
  return;
}

Assistant:

void pnga_step_bound_info(Integer g_xx, Integer g_vv, Integer g_xxll,
                          Integer g_xxuu,  void *boundmin, void *wolfemin,
                          void *boundmax)
{
  Integer xxtype, xxndim;
  Integer vvtype, vvndim;
  Integer xxlltype, xxllndim;
  Integer xxuutype, xxuundim;
  Integer xxlo[MAXDIM],xxhi[MAXDIM];
  Integer vvlo[MAXDIM],vvhi[MAXDIM];
  Integer xxlllo[MAXDIM],xxllhi[MAXDIM];
  Integer xxuulo[MAXDIM],xxuuhi[MAXDIM];

  pnga_inquire(g_xx,  &xxtype, &xxndim, xxhi);
  pnga_inquire(g_vv,  &vvtype, &vvndim, vvhi);
  pnga_inquire(g_xxll,  &xxlltype, &xxllndim, xxllhi);
  pnga_inquire(g_xxuu,  &xxuutype, &xxuundim, xxuuhi);
  while(xxndim){
    xxlo[xxndim-1]=1;
    xxndim--;
    vvlo[vvndim-1]=1;
    vvndim--;
    xxlllo[xxllndim-1]=1;
    xxllndim--;
    xxuulo[xxuundim-1]=1;
    xxuundim--;
  }

  pnga_step_bound_info_patch(g_xx,xxlo,xxhi, g_vv,vvlo,vvhi, g_xxll,xxlllo,xxllhi, g_xxuu,xxuulo,xxuuhi, boundmin, wolfemin, boundmax);
}